

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

void small_alloc_info(small_alloc *alloc,void *ptr,size_t size,small_alloc_info *info)

{
  small_mempool *psVar1;
  ulong uVar2;
  
  psVar1 = small_mempool_search(alloc,size);
  info->is_large = psVar1 == (small_mempool *)0x0;
  if (psVar1 == (small_mempool *)0x0) {
    info->real_size = size;
  }
  else {
    uVar2 = (ulong)(psVar1->used_pool->pool).objsize;
    info->real_size = uVar2;
    if (uVar2 < size) {
      __assert_fail("info->real_size >= size",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x1de,
                    "void small_alloc_info(struct small_alloc *, void *, size_t, struct small_alloc_info *)"
                   );
    }
  }
  return;
}

Assistant:

void
small_alloc_info(struct small_alloc *alloc, void *ptr, size_t size,
		 struct small_alloc_info *info)
{
	(void)ptr;
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	info->is_large = small_mempool == NULL;
	if (info->is_large)
		info->real_size = size;
	else
		info->real_size = small_mempool->used_pool->pool.objsize;
	assert(info->real_size >= size);
}